

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O3

pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_> *
mathiu::impl::coeffAndTerm
          (pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
           *__return_storage_ptr__,Expr *e)

{
  size_t sVar1;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  *this;
  Product *v;
  _Base_ptr p_Var2;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> _Var3;
  undefined8 uVar4;
  bool bVar5;
  IdProcess IVar6;
  _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  __tmp_1;
  variant_alternative_t<1UL,_variant<monostate,_const_Product_*,_Subrange<_Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>,__Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>_>,_shared_ptr<const_Expr>,_const_int_*,_const_Fraction_*,_bool>_>
  *value;
  size_t sVar7;
  variant_alternative_t<3UL,_variant<monostate,_const_Product_*,_Subrange<_Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>,__Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>_>,_shared_ptr<const_Expr>,_const_int_*,_const_Fraction_*,_bool>_>
  *value_00;
  variant_alternative_t<4UL,_variant<monostate,_const_Product_*,_Subrange<_Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>,__Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>_>,_shared_ptr<const_Expr>,_const_int_*,_const_Fraction_*,_bool>_>
  *value_01;
  variant_alternative_t<5UL,_variant<monostate,_const_Product_*,_Subrange<_Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>,__Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>_>,_shared_ptr<const_Expr>,_const_int_*,_const_Fraction_*,_bool>_>
  *value_02;
  IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_> *pIVar8;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>_&>
  pIVar9;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>_&>
  pPVar10;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  *__x;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>_&>
  pIVar11;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*> *p_Var12;
  shared_ptr<const_mathiu::impl::Expr> *__a;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*> _Var13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long lVar14;
  _Atomic_word *p_Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  _Atomic_word _Var16;
  undefined **ppuVar17;
  undefined1 **ppuVar18;
  undefined8 *puVar19;
  undefined8 *puVar20;
  _Atomic_word *p_Var21;
  _Atomic_word *p_Var22;
  byte bVar23;
  Product pCopy;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> icoeff;
  undefined1 local_921 [9];
  undefined1 local_918 [16];
  __index_type local_908;
  __index_type local_8f0;
  __index_type local_8d8;
  undefined8 local_8c8;
  _Variadic_union<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_8c0;
  undefined8 local_898;
  __index_type local_890;
  __index_type local_878;
  __index_type local_860;
  __index_type local_848;
  size_t local_840;
  anon_class_1_0_00000001 *local_830;
  InternalPatternT<bool> IStack_828;
  undefined7 uStack_827;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> local_820;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_818;
  element_type *local_7d0;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_7c8;
  undefined8 local_7a0 [13];
  undefined1 local_738 [40];
  _Atomic_word local_710 [8];
  element_type *local_6f0;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_6e8;
  undefined8 local_6c0 [13];
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_658;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_630;
  undefined1 local_5f0;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_5e8;
  element_type *local_5a0;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_598;
  undefined8 local_570 [13];
  undefined1 local_508 [8];
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  _Stack_500;
  undefined8 local_4d8 [14];
  undefined8 local_468;
  undefined1 auStack_460 [8];
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  _Stack_458;
  undefined1 *local_410;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_408;
  undefined8 local_3e0 [4];
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_3c0 [2];
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_398;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_388;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_378;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  *local_368;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  *local_360;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_358;
  undefined1 *local_330;
  undefined8 local_328 [10];
  undefined1 *local_2d8;
  undefined1 local_2d0;
  undefined1 *local_2c8;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> _Stack_2c0;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_2b8;
  undefined1 *local_270;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_268;
  undefined8 local_240 [13];
  anon_class_1_0_00000001 *local_1d8;
  InternalPatternT<bool> IStack_1d0;
  undefined7 uStack_1cf;
  undefined1 *local_1c8;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> _Stack_1c0;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_1b8;
  undefined1 *local_170;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_168;
  undefined8 local_140 [13];
  anon_class_1_0_00000001 *local_d8;
  InternalPatternT<bool> IStack_d0;
  undefined7 uStack_cf;
  element_type *local_c8;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_c0;
  undefined8 local_98 [13];
  
  bVar23 = 0;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_658);
  local_468 = (undefined1 *)((ulong)local_468._4_4_ << 0x20);
  auStack_460 = (undefined1  [8])0x0;
  _Stack_458._M_u._M_rest = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)0x0;
  _Stack_458._M_u._8_8_ = 0;
  _Stack_458._M_u._16_8_ = 0;
  _Stack_458._M_u._24_8_ = 0;
  _Stack_458._M_u._32_8_ = 0;
  _Stack_458._M_u._40_8_ = 0;
  local_630._0_4_ = 0;
  local_630._M_first._M_storage._M_storage[0x38] = '\0';
  local_5f0 = 0;
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
                       *)auStack_460);
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_358,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_658);
  local_330 = &matchit::impl::deref;
  ppuVar17 = &PTR_asPointer<mathiu::impl::Fraction>_0026b0b0;
  puVar19 = local_328;
  for (lVar14 = 10; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar19 = *ppuVar17;
    ppuVar17 = ppuVar17 + (ulong)bVar23 * -2 + 1;
    puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
  }
  local_2d8 = &matchit::impl::cast<bool>;
  local_2d0 = 1;
  local_c8 = (element_type *)local_921;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_c0,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_358);
  ppuVar18 = &local_330;
  puVar19 = local_98;
  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar19 = *ppuVar18;
    ppuVar18 = ppuVar18 + (ulong)bVar23 * -2 + 1;
    puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
  }
  local_508 = (undefined1  [8])local_c8;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&_Stack_500,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_c0);
  puVar19 = local_98;
  puVar20 = local_4d8;
  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar20 = *puVar19;
    puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
    puVar20 = puVar20 + (ulong)bVar23 * -2 + 1;
  }
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&local_5e8._M_first,
             (Id<mathiu::impl::Product> *)&local_630._M_first);
  local_5a0 = (element_type *)local_508;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_598,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&_Stack_500);
  puVar19 = local_4d8;
  puVar20 = local_570;
  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar20 = *puVar19;
    puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
    puVar20 = puVar20 + (ulong)bVar23 * -2 + 1;
  }
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)local_738,(Id<mathiu::impl::Product> *)&local_5e8._M_first
            );
  local_6f0 = local_5a0;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_6e8,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_598);
  puVar19 = local_570;
  puVar20 = local_6c0;
  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar20 = *puVar19;
    puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
    puVar20 = puVar20 + (ulong)bVar23 * -2 + 1;
  }
  local_820 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)
              &matchit::impl::deref;
  local_921._1_8_ = __return_storage_ptr__;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&local_818._M_first,(Id<mathiu::impl::Product> *)local_738
            );
  local_7d0 = local_6f0;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_7c8,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_6e8);
  puVar19 = local_6c0;
  puVar20 = local_7a0;
  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar20 = *puVar19;
    puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
    puVar20 = puVar20 + (ulong)bVar23 * -2 + 1;
  }
  this = (_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
          *)(local_918 + 8);
  local_918._0_8_ = local_820;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)this,(Id<mathiu::impl::Product> *)&local_818._M_first);
  local_8c8 = local_7d0;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_8c0._M_first,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_7c8);
  puVar19 = local_7a0;
  puVar20 = &local_898;
  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar20 = *puVar19;
    puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
    puVar20 = puVar20 + (ulong)bVar23 * -2 + 1;
  }
  local_830 = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  IStack_828 = true;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_7c8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)&local_818._M_first);
  local_2c8 = &matchit::impl::asPointer<mathiu::impl::Product>;
  _Stack_2c0 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)
               local_918._0_8_;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&local_2b8,(Id<mathiu::impl::Product> *)this);
  local_270 = (undefined1 *)local_8c8;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_268,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_8c0._M_first);
  puVar19 = &local_898;
  puVar20 = local_240;
  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar20 = *puVar19;
    puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
    puVar20 = puVar20 + (ulong)bVar23 * -2 + 1;
  }
  uStack_1cf = uStack_827;
  IStack_1d0 = IStack_828;
  local_1d8 = local_830;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_8c0._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(this);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_6e8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)local_738);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_598);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)&local_5e8._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&_Stack_500);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_c0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_358);
  local_1c8 = local_2c8;
  _Stack_1c0 = _Stack_2c0;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&local_1b8,(Id<mathiu::impl::Product> *)&local_2b8);
  local_170 = local_270;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_168,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_268);
  puVar19 = local_240;
  puVar20 = local_140;
  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar20 = *puVar19;
    puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
    puVar20 = puVar20 + (ulong)bVar23 * -2 + 1;
  }
  local_d8 = local_1d8;
  IStack_d0 = IStack_1d0;
  uStack_cf = uStack_1cf;
  local_468 = local_1c8;
  auStack_460 = (undefined1  [8])_Stack_1c0;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&_Stack_458,(Id<mathiu::impl::Product> *)&local_1b8);
  local_410 = local_170;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_408,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_168);
  puVar19 = local_140;
  puVar20 = local_3e0;
  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar20 = *puVar19;
    puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
    puVar20 = puVar20 + (ulong)bVar23 * -2 + 1;
  }
  local_378.mUnary = local_d8;
  local_378.mPattern = IStack_d0;
  local_378._9_7_ = uStack_cf;
  _Stack_500._M_u._8_8_ = (element_type *)0x0;
  _Stack_500._M_u._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_508 = (undefined1  [8])0x0;
  _Stack_500._M_u._M_rest =
       (_Variadic_union<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>)0x0;
  local_368 = &local_630;
  local_360 = &local_658;
  memset((variant<std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
          *)local_918,0,0xd8);
  local_908 = '\0';
  local_8f0 = '\0';
  local_8d8 = '\0';
  local_8c0._M_first._M_storage._M_storage[0] = '\0';
  local_8c0._M_first._M_storage._M_storage[0x18] = '\0';
  local_890 = '\0';
  local_878 = '\0';
  local_860 = '\0';
  local_848 = '\0';
  local_840 = 0;
  local_820 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)0x0;
  if (*(__index_type *)
       ((long)&(e->super_ExprVariant).
               super__Variant_base<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Move_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Copy_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Move_ctor_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Copy_ctor_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Variant_storage_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
       + 0x38) == '\b') {
    local_820 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)e;
  }
  std::
  variant<std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
  ::operator=((variant<std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
               *)local_918,(Product **)&local_820);
  lVar14 = local_840 * 0x18;
  local_840 = local_840 + 1;
  value = std::
          get<1ul,std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
                    ((variant<std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>
                      *)(local_918 + lVar14));
  bVar5 = matchit::impl::
          PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
          ::
          matchPatternImpl<mathiu::impl::Product_const*&,matchit::impl::Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>>
                    (value,&local_378,2,
                     (Context<const_mathiu::impl::Product_*,_bool,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool>
                      *)local_918);
  if (!bVar5) {
    IVar6 = kCANCEL;
    goto LAB_00183be8;
  }
  v = *value;
  if ((v->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pIVar8 = &std::
              visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                          *)&local_820._M_first,
                         (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                          *)&local_408)->
              super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>;
LAB_00183b9a:
    matchit::impl::IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>::reset(pIVar8,4);
LAB_00183ba7:
    IVar6 = kCANCEL;
  }
  else {
    p_Var2 = (v->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_820 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)
                p_Var2[1]._M_left;
    local_818._M_rest =
         (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)p_Var2[1]._M_right;
    if (local_818._M_rest != (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)0x0)
    {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)((long)local_818._M_rest + 8) = *(int *)((long)local_818._M_rest + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)((long)local_818._M_rest + 8) = *(int *)((long)local_818._M_rest + 8) + 1;
      }
    }
    std::
    variant<std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
    ::operator=((variant<std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
                 *)(local_918 + local_840 * 0x18),
                (shared_ptr<const_mathiu::impl::Expr> *)&local_820._M_first);
    sVar1 = local_840 + 1;
    sVar7 = local_840;
    local_840 = sVar1;
    if (local_818._M_rest != (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)0x0)
    {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_818._M_rest);
      sVar7 = local_840 - 1;
    }
    value_00 = std::
               get<3ul,std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
                         ((variant<std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>
                           *)(local_918 + sVar7 * 0x18));
    bVar5 = matchit::impl::
            PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
            ::
            matchPatternImpl<std::shared_ptr<mathiu::impl::Expr_const>&,matchit::impl::Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>>
                      (value_00,&local_388,8,
                       (Context<const_mathiu::impl::Product_*,_bool,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool>
                        *)local_918);
    if (!bVar5) {
LAB_00183b50:
      pIVar8 = &std::
                visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                            *)&local_820._M_first,
                           (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                            *)&local_408)->
                super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>;
      matchit::impl::IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>::reset(pIVar8,6);
      pIVar8 = &std::
                visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                            *)&local_820._M_first,
                           (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                            *)&local_408)->
                super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>;
      matchit::impl::IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>::reset(pIVar8,5);
      pIVar8 = &std::
                visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                            *)&local_820._M_first,
                           (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                            *)&local_408)->
                super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>;
      goto LAB_00183b9a;
    }
    _Var3 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)
            (value_00->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
    local_820 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)0x0;
    if (*(char *)&((_Base_ptr)((long)_Var3 + 0x20))->_M_right == '\0') {
      local_820 = _Var3;
    }
    std::
    variant<std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
    ::operator=((variant<std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
                 *)(local_918 + local_840 * 0x18),(int **)&local_820);
    lVar14 = local_840 * 0x18;
    local_840 = local_840 + 1;
    value_01 = std::
               get<4ul,std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
                         ((variant<std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>
                           *)(local_918 + lVar14));
    bVar5 = matchit::impl::
            PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
            ::
            matchPatternImpl<int_const*&,matchit::impl::Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>>
                      (value_01,&local_398,0xc,
                       (Context<const_mathiu::impl::Product_*,_bool,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool>
                        *)local_918);
    if (!bVar5) {
      local_820 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)0x0;
      if (*(char *)&((_Base_ptr)((long)_Var3 + 0x20))->_M_right == '\x01') {
        local_820 = _Var3;
      }
      std::
      variant<std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
      ::operator=((variant<std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
                   *)(local_918 + local_840 * 0x18),(Fraction **)&local_820);
      lVar14 = local_840 * 0x18;
      local_840 = local_840 + 1;
      value_02 = std::
                 get<5ul,std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
                           ((variant<std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>
                             *)(local_918 + lVar14));
      bVar5 = matchit::impl::
              PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
              ::
              matchPatternImpl<mathiu::impl::Fraction_const*&,matchit::impl::Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>>
                        (value_02,local_3c0,0xc,
                         (Context<const_mathiu::impl::Product_*,_bool,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool>
                          *)local_918);
      if (!bVar5) goto LAB_00183b50;
    }
    bVar5 = matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::
            matchValue<std::shared_ptr<mathiu::impl::Expr_const>>
                      ((Id<std::shared_ptr<mathiu::impl::Expr_const>> *)&local_408,value_00);
    IVar6 = (IdProcess)bVar5;
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_408,7,IVar6);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_408,6,(uint)bVar5);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_408,5,IVar6);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_408,4,IVar6);
    if (!bVar5) goto LAB_00183ba7;
    bVar5 = matchit::impl::Id<mathiu::impl::Product>::matchValue<mathiu::impl::Product_const&>
                      ((Id<mathiu::impl::Product> *)&_Stack_458,v);
    IVar6 = (IdProcess)bVar5;
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
              ((Id<mathiu::impl::Product> *)&_Stack_458,4,(uint)bVar5);
  }
  matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
  processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_408,3,IVar6);
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
            ((Id<mathiu::impl::Product> *)&_Stack_458,3,IVar6);
  matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
  processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_408,2,IVar6);
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
            ((Id<mathiu::impl::Product> *)&_Stack_458,2,IVar6);
LAB_00183be8:
  matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
  processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_408,1,IVar6);
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
            ((Id<mathiu::impl::Product> *)&_Stack_458,1,IVar6);
  matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
  processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_408,0,IVar6);
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
            ((Id<mathiu::impl::Product> *)&_Stack_458,0,IVar6);
  if (IVar6 != kCANCEL) {
    pIVar9 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>&)_1_,matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,matchit::impl::IdBlock<mathiu::impl::Product>*>&>
                       ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                         *)&local_820._M_first,
                        (variant<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                         *)&local_368->_M_first);
    pPVar10 = std::
              visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Product,mathiu::impl::Product*,mathiu::impl::Product_const*>const&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                          *)&local_820._M_first,
                         &(pIVar9->super_IdBlockBase<mathiu::impl::Product>).mVariant);
    if ((pPVar10->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_node_count < 3) {
      pIVar11 = std::
                visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                            *)&local_820._M_first,
                           (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                            *)local_360);
      __a = (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__deduce_visit_result<const_std::shared_ptr<const_mathiu::impl::Expr>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1186:30),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1187:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1188:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1189:33)>_&&,_const_std::variant<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>_&>
              ::_S_vtable._M_arr
              [*(__index_type *)
                ((long)&(pIVar11->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>).
                        mVariant.
                        super__Variant_base<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                        .
                        super__Move_assign_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                        .
                        super__Copy_assign_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                        .
                        super__Move_ctor_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                        .
                        super__Copy_ctor_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                + 0x10)]._M_data)
                      ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                        *)&local_820,
                       &(pIVar11->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>).
                        mVariant);
      pIVar9 = std::
               visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>&)_1_,matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,matchit::impl::IdBlock<mathiu::impl::Product>*>&>
                         ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                           *)&local_820._M_first,
                          (variant<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                           *)&local_368->_M_first);
      pPVar10 = std::
                visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Product,mathiu::impl::Product*,mathiu::impl::Product_const*>const&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                            *)&local_820._M_first,
                           &(pIVar9->super_IdBlockBase<mathiu::impl::Product>).mVariant);
      lVar14 = std::_Rb_tree_decrement
                         (&(pPVar10->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header)
      ;
      std::
      pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>::
      pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_true>
                ((pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                  *)&local_5e8._M_first,__a,(shared_ptr<const_mathiu::impl::Expr> *)(lVar14 + 0x30))
      ;
    }
    else {
      pIVar9 = std::
               visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>&)_1_,matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,matchit::impl::IdBlock<mathiu::impl::Product>*>&>
                         ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                           *)local_738,
                          (variant<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                           *)&local_368->_M_first);
      __x = (_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
             *)std::
               visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Product,mathiu::impl::Product*,mathiu::impl::Product_const*>const&>
                         ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                           *)local_738,&(pIVar9->super_IdBlockBase<mathiu::impl::Product>).mVariant)
      ;
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
      ::_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                  *)&local_820._M_first,__x);
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
      ::_M_erase_aux((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                      *)&local_820._M_first,(const_iterator)local_818._16_8_);
      pIVar11 = std::
                visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                            *)local_738,
                           (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                            *)local_360);
      p_Var12 = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*> *)
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__deduce_visit_result<const_std::shared_ptr<const_mathiu::impl::Expr>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1186:30),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1187:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1188:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1189:33)>_&&,_const_std::variant<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>_&>
                  ::_S_vtable._M_arr
                  [*(__index_type *)
                    ((long)&(pIVar11->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>)
                            .mVariant.
                            super__Variant_base<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                            .
                            super__Move_assign_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                            .
                            super__Copy_assign_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                            .
                            super__Move_ctor_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                            .
                            super__Copy_ctor_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                    + 0x10)]._M_data)
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                            *)local_738,
                           &(pIVar11->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>)
                            .mVariant);
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
      ::_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                  *)local_738,
                 (_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                  *)&local_820._M_first);
      local_5e8._24_8_ = operator_new(0x50);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e8._24_8_)->_M_use_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e8._24_8_)->_M_weak_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e8._24_8_)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00263778;
      p_Var15 = &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_5e8._24_8_ + 0x10))->
                 _M_use_count;
      if ((_func_int **)local_738._16_8_ == (_func_int **)0x0) {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_5e8._24_8_ + 0x20))->
        _vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var21 = &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_5e8._24_8_ + 0x30))->
                   _M_use_count;
        _Var16 = 0;
        p_Var22 = p_Var15;
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_5e8._24_8_ + 0x20))->
        _vptr__Sp_counted_base = (_func_int **)local_738._16_8_;
        *(_Atomic_word **)(local_738._16_8_ + 8) = p_Var15;
        p_Var21 = local_710;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_5e8._24_8_ + 0x30))->_M_use_count =
             local_710[0];
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_5e8._24_8_ + 0x30))->_M_weak_count =
             local_710[1];
        local_738._16_8_ = (_func_int **)0x0;
        p_Var15 = (_Atomic_word *)local_738._24_8_;
        p_Var22 = (_Atomic_word *)local_738._32_8_;
        _Var16 = local_738._8_4_;
        local_738._24_8_ = local_738 + 8;
        local_738._32_8_ = local_738 + 8;
      }
      *(_Atomic_word **)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_5e8._24_8_ + 0x20))->_M_use_count =
           p_Var15;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_5e8._24_8_ + 0x30))->
      _vptr__Sp_counted_base = (_func_int **)p_Var22;
      *(undefined8 *)p_Var21 = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_5e8._24_8_ + 0x10))->_M_use_count =
           _Var16;
      *(undefined1 *)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_5e8._24_8_ + 0x40))->_M_use_count =
           8;
      local_5e8._16_8_ = local_5e8._24_8_ + 0x10;
      local_5e8._M_rest = *p_Var12;
      local_5e8._8_8_ = *(undefined8 *)&p_Var12[1]._M_rest;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e8._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e8._8_8_)->_M_use_count + 1;
        }
      }
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                   *)local_738);
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                   *)&local_820._M_first);
    }
    std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
    ::operator=((pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                 *)local_508,(type)&local_5e8._M_first);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e8._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e8._24_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5e8._8_8_);
    }
  }
  lVar14 = 0xc0;
  do {
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>
                         *)(local_918 + lVar14));
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  if (IVar6 == kCANCEL) {
    memset(local_918,0,0xd8);
    local_908 = '\0';
    local_8f0 = '\0';
    local_8d8 = '\0';
    local_8c0._M_first._M_storage._M_storage[0] = '\0';
    local_8c0._M_first._M_storage._M_storage[0x18] = '\0';
    local_890 = '\0';
    local_878 = '\0';
    local_860 = '\0';
    local_848 = '\0';
    local_840 = 0;
    _Var13 = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)operator_new(0x50);
    *(_Base_ptr *)((long)_Var13 + 8) = (_Base_ptr)0x100000001;
    *(undefined ***)_Var13 = &PTR___Sp_counted_ptr_inplace_00263778;
    *(undefined4 *)((long)_Var13 + 0x10) = 1;
    *(undefined1 *)((long)_Var13 + 0x48) = 0;
    local_738._0_8_ = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mathiu::impl::Expr_const,std::allocator<mathiu::impl::Expr>,mathiu::impl::Expr_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_738 + 8),(Expr **)local_738,
               (allocator<mathiu::impl::Expr> *)&local_5e8,e);
    local_820 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)
                ((long)_Var13 + 0x10);
    local_818._16_8_ = CONCAT44(local_738._12_4_,local_738._8_4_);
    local_818._8_8_ = local_738._0_8_;
    local_818._M_rest = _Var13;
    std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
    ::operator=((pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                 *)local_508,(type)&local_820._M_first);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_818._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_818._16_8_);
    }
    if (local_818._M_rest != (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)0x0)
    {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_818._M_rest);
    }
    lVar14 = 0xc0;
    do {
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>
                           *)(local_918 + lVar14));
      lVar14 = lVar14 + -0x18;
    } while (lVar14 != -0x18);
  }
  uVar4 = local_921._1_8_;
  (((shared_ptr<const_mathiu::impl::Expr> *)local_921._1_8_)->
  super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)local_508;
  (((shared_ptr<const_mathiu::impl::Expr> *)local_921._1_8_)->
  super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_500._M_u._M_rest;
  (((shared_ptr<const_mathiu::impl::Expr> *)(local_921._1_8_ + 0x10))->
  super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)_Stack_500._M_u._8_8_;
  (((shared_ptr<const_mathiu::impl::Expr> *)(local_921._1_8_ + 0x10))->
  super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_500._M_u._16_8_;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_408);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&_Stack_458);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_168);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&local_1b8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_268);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&local_2b8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)&local_630._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_658);
  return (pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
          *)uVar4;
}

Assistant:

std::pair<ExprPtr, ExprPtr> coeffAndTerm(Expr const &e)
    {
        constexpr auto firstIsCoeff = [](auto &&id, auto &&whole)
        {
            constexpr auto asCoeff = or_(as<Integer>(_), as<Fraction>(_));
            constexpr auto second = [](auto &&p)
            {
                return p.second;
            };
            // second part of the first pair
            return as<Product>(whole.at(ds(app(second, id.at(some(asCoeff))), ooo)));
        };

        Id<ExprPtr> icoeff;
        Id<Product> ip;
        return match(e)(
            pattern | firstIsCoeff(icoeff, ip) = [&]
            {
                if ((*ip).size() > 2)
                {
                    auto pCopy = *ip;
                    pCopy.erase(pCopy.begin());
                    return std::make_pair(*icoeff, makeSharedExprPtr(Product{pCopy}));
                }
                // single value left.
                // the basic unary transformation.
                return std::make_pair(*icoeff, (*(*ip).rbegin()).second);
            },
            pattern | _ = [&]
            { return std::make_pair(1_i, makeSharedExprPtr(e)); });
    }